

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O3

void __thiscall xe::ContainerFormatParser::advance(ContainerFormatParser *this)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uint uVar5;
  State SVar6;
  int iVar7;
  int iVar8;
  
  if (this->m_element != CONTAINERELEMENT_INCOMPLETE) {
    iVar7 = this->m_elementLen;
    (this->m_buf).m_back = ((this->m_buf).m_back + iVar7) % (this->m_buf).m_size;
    (this->m_buf).m_numElements = (this->m_buf).m_numElements - iVar7;
    this->m_element = CONTAINERELEMENT_INCOMPLETE;
    this->m_elementLen = 0;
    (this->m_attribute)._M_string_length = 0;
    *(this->m_attribute)._M_dataplus._M_p = '\0';
    (this->m_value)._M_string_length = 0;
    *(this->m_value)._M_dataplus._M_p = '\0';
  }
  iVar7 = this->m_elementLen;
  iVar8 = (this->m_buf).m_numElements;
  if (iVar7 < iVar8) {
    puVar4 = (this->m_buf).m_buffer;
    SVar6 = this->m_state;
    iVar2 = (this->m_buf).m_back;
    iVar3 = (this->m_buf).m_size;
    do {
      iVar7 = iVar7 + 1;
      uVar1 = puVar4[(iVar2 + iVar7 + -1) % iVar3];
      this->m_elementLen = iVar7;
      if (uVar1 == '\0') {
        if (iVar7 == 1) {
          this->m_element = CONTAINERELEMENT_END_OF_STRING;
          return;
        }
        if (SVar6 == STATE_CONTAINER_LINE) {
          parseContainerLine(this);
          return;
        }
        goto LAB_00124b02;
      }
      if ((uVar1 == '\r') || (uVar1 == '\n')) {
        uVar5 = 0xffffffff;
        if (iVar7 < iVar8) {
          uVar5 = (uint)puVar4[(iVar2 + iVar7) % iVar3];
        }
        if ((uVar1 == '\n') || ((uVar5 != 0xffffffff && (uVar5 != 10)))) {
          if (SVar6 == STATE_CONTAINER_LINE) {
            parseContainerLine(this);
          }
          else {
            this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
          }
          this->m_state = STATE_AT_LINE_START;
          return;
        }
      }
      else if (SVar6 == STATE_AT_LINE_START) {
        SVar6 = (uVar1 != '#') + STATE_CONTAINER_LINE;
        this->m_state = SVar6;
      }
    } while (iVar7 != iVar8);
  }
  else {
    SVar6 = this->m_state;
    iVar8 = iVar7;
  }
  if ((0 < iVar8) && (SVar6 == STATE_DATA)) {
LAB_00124b02:
    this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
  }
  return;
}

Assistant:

void ContainerFormatParser::advance (void)
{
	if (m_element != CONTAINERELEMENT_INCOMPLETE)
	{
		m_buf.popBack(m_elementLen);

		m_element		= CONTAINERELEMENT_INCOMPLETE;
		m_elementLen	= 0;
		m_attribute.clear();
		m_value.clear();
	}

	for (;;)
	{
		int curChar = getChar(m_elementLen);

		if (curChar != (int)END_OF_BUFFER)
			m_elementLen += 1;

		if (curChar == END_OF_STRING)
		{
			if (m_elementLen == 1)
				m_element = CONTAINERELEMENT_END_OF_STRING;
			else if (m_state == STATE_CONTAINER_LINE)
				parseContainerLine();
			else
				m_element = CONTAINERELEMENT_TEST_LOG_DATA;

			break;
		}
		else if (curChar == (int)END_OF_BUFFER)
		{
			if (m_elementLen > 0 && m_state == STATE_DATA)
				m_element = CONTAINERELEMENT_TEST_LOG_DATA;

			break;
		}
		else if (curChar == '\r' || curChar == '\n')
		{
			// Check for \r\n
			int nextChar = getChar(m_elementLen);
			if (curChar == '\n' || (nextChar != (int)END_OF_BUFFER && nextChar != '\n'))
			{
				if (m_state == STATE_CONTAINER_LINE)
					parseContainerLine();
				else
					m_element = CONTAINERELEMENT_TEST_LOG_DATA;

				m_state = STATE_AT_LINE_START;
				break;
			}
			// else handle following end or \n in next iteration.
		}
		else if (m_state == STATE_AT_LINE_START)
		{
			DE_ASSERT(m_elementLen == 1);
			m_state = (curChar == '#') ? STATE_CONTAINER_LINE : STATE_DATA;
		}
	}
}